

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

contenc_writer *
new_unencoding_writer(Curl_easy *data,content_encoding *handler,contenc_writer *downstream)

{
  CURLcode CVar1;
  contenc_writer *local_30;
  contenc_writer *writer;
  size_t sz;
  contenc_writer *downstream_local;
  content_encoding *handler_local;
  Curl_easy *data_local;
  
  local_30 = (contenc_writer *)(*Curl_ccalloc)(1,handler->paramsize + 0x10);
  if (local_30 != (contenc_writer *)0x0) {
    local_30->handler = handler;
    local_30->downstream = downstream;
    CVar1 = (*handler->init_writer)(data,local_30);
    if (CVar1 != CURLE_OK) {
      (*Curl_cfree)(local_30);
      local_30 = (contenc_writer *)0x0;
    }
  }
  return local_30;
}

Assistant:

static struct contenc_writer *
new_unencoding_writer(struct Curl_easy *data,
                      const struct content_encoding *handler,
                      struct contenc_writer *downstream)
{
  size_t sz = offsetof(struct contenc_writer, params) + handler->paramsize;
  struct contenc_writer *writer = (struct contenc_writer *)calloc(1, sz);

  if(writer) {
    writer->handler = handler;
    writer->downstream = downstream;
    if(handler->init_writer(data, writer)) {
      free(writer);
      writer = NULL;
    }
  }

  return writer;
}